

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask4_16(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  uVar1 = in[10];
  uVar2 = in[0xb];
  uVar3 = in[0xe];
  uVar4 = in[0xc];
  *out = in[7] << 0x1c |
         in[6] << 0x18 | in[5] << 0x14 | in[4] << 0x10 | in[3] << 0xc | in[2] << 8 |
         in[1] << 4 | *in;
  out[1] = in[0xf] << 0x1c |
           uVar3 << 0x18 | in[0xd] << 0x14 | uVar4 << 0x10 | uVar2 << 0xc | uVar1 << 8 |
           in[9] << 4 | in[8];
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask4_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  ++in;

  return out;
}